

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O3

void __thiscall
QTreeWidgetItemPrivate::sortChildren
          (QTreeWidgetItemPrivate *this,int column,SortOrder order,bool climb)

{
  QTreeModel *this_00;
  iterator iVar1;
  iterator iVar2;
  int column_00;
  
  this_00 = QTreeWidgetItem::treeModel(this->q,(QTreeWidget *)0x0);
  if (this_00 != (QTreeModel *)0x0) {
    QTreeModel::sortItems(this_00,&this->q->children,column_00,order);
    if (climb) {
      iVar1 = QList<QTreeWidgetItem_*>::begin(&this->q->children);
      while( true ) {
        iVar2 = QList<QTreeWidgetItem_*>::end(&this->q->children);
        if (iVar1.i == iVar2.i) break;
        sortChildren((*iVar1.i)->d,column,order,true);
        iVar1.i = iVar1.i + 1;
      }
    }
  }
  return;
}

Assistant:

void QTreeWidgetItemPrivate::sortChildren(int column, Qt::SortOrder order, bool climb)
{
    QTreeModel *model = q->treeModel();
    if (!model)
        return;
    model->sortItems(&q->children, column, order);
    if (climb) {
        QList<QTreeWidgetItem*>::iterator it = q->children.begin();
        for (; it != q->children.end(); ++it) {
            //here we call the private object's method to avoid emitting
            //the layoutAboutToBeChanged and layoutChanged signals
            (*it)->d->sortChildren(column, order, climb);
        }
    }
}